

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux.cpp
# Opt level: O2

FUNCTION_RETURN
parse_blkid(string *blkid_file_content,vector<DiskInfo,_std::allocator<DiskInfo>_> *diskInfos_out,
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *disk_by_uuid)

{
  long lVar1;
  uint out_size;
  int iVar2;
  allocator local_619;
  vector<DiskInfo,_std::allocator<DiskInfo>_> *local_618;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_610;
  string local_608;
  int local_5e8;
  string disk_type;
  string label;
  string device;
  string disk_sn;
  string cur_dev;
  DiskInfo diskInfo;
  
  local_618 = diskInfos_out;
  local_610 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)disk_by_uuid;
  memset(&diskInfo,0,0x510);
  iVar2 = 0;
  while( true ) {
    lVar1 = std::__cxx11::string::find((char *)blkid_file_content,0x1a0c3d);
    if (lVar1 == -1) break;
    std::__cxx11::string::substr((ulong)&cur_dev,(ulong)blkid_file_content);
    diskInfo.id = iVar2;
    std::__cxx11::string::find_last_of((char *)&cur_dev,0x1a829f);
    std::__cxx11::string::substr((ulong)&device,(ulong)&cur_dev);
    license::mstrlcpy(diskInfo.device,device._M_dataplus._M_p,0x400);
    std::__cxx11::string::string((string *)&local_608,"PARTLABEL",(allocator *)&disk_sn);
    getAttribute(&label,&cur_dev,&local_608);
    std::__cxx11::string::~string((string *)&local_608);
    license::mstrlcpy(diskInfo.label,label._M_dataplus._M_p,0xff);
    std::__cxx11::string::string((string *)&local_608,"UUID",(allocator *)&disk_type);
    getAttribute(&disk_sn,&cur_dev,&local_608);
    std::__cxx11::string::~string((string *)&local_608);
    parseUUID(disk_sn._M_dataplus._M_p,diskInfo.disk_sn,out_size);
    std::__cxx11::string::string((string *)&local_608,"TYPE",&local_619);
    getAttribute(&disk_type,&cur_dev,&local_608);
    std::__cxx11::string::~string((string *)&local_608);
    std::__cxx11::string::string((string *)&local_608,(string *)&disk_sn);
    local_5e8 = diskInfo.id;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string,int>>(local_610,&local_608);
    std::__cxx11::string::~string((string *)&local_608);
    diskInfo.label_initialized = true;
    diskInfo.sn_initialized = true;
    diskInfo.preferred = std::operator==(&disk_type,"swap");
    std::vector<DiskInfo,_std::allocator<DiskInfo>_>::push_back(local_618,&diskInfo);
    std::__cxx11::string::~string((string *)&disk_type);
    std::__cxx11::string::~string((string *)&disk_sn);
    std::__cxx11::string::~string((string *)&label);
    std::__cxx11::string::~string((string *)&device);
    std::__cxx11::string::~string((string *)&cur_dev);
    iVar2 = iVar2 + 1;
  }
  return FUNC_RET_OK;
}

Assistant:

FUNCTION_RETURN parse_blkid(const std::string &blkid_file_content, std::vector<DiskInfo> &diskInfos_out,
							std::unordered_map<std::string, int> &disk_by_uuid) {
	DiskInfo diskInfo = {};
	int diskNum = 0;
	for (std::size_t oldpos = 0, pos = 0; (pos = blkid_file_content.find("</device>", oldpos)) != std::string::npos;
		 oldpos = pos + 1) {
		std::string cur_dev = blkid_file_content.substr(oldpos, pos);
		diskInfo.id = diskNum++;
		std::string device = cur_dev.substr(cur_dev.find_last_of(">") + 1);
		mstrlcpy(diskInfo.device, device.c_str(), MAX_PATH);
		std::string label = getAttribute(cur_dev, "PARTLABEL");
		mstrlcpy(diskInfo.label, label.c_str(), 255);
		std::string disk_sn = getAttribute(cur_dev, "UUID");
		parseUUID(disk_sn.c_str(), diskInfo.disk_sn, sizeof(diskInfo.disk_sn));
		std::string disk_type = getAttribute(cur_dev, "TYPE");
		disk_by_uuid.insert(std::pair<std::string, int>(disk_sn, diskInfo.id));
		diskInfo.label_initialized = true;
		diskInfo.sn_initialized = true;
		// unlikely that somebody put the swap on a removable disk.
		// this is a first rough guess on what can be a preferred disk for blkid devices
		// just in case /etc/fstab can't be accessed or it is not up to date.
		diskInfo.preferred = (disk_type == "swap");
		diskInfos_out.push_back(diskInfo);
	}
	return FUNCTION_RETURN::FUNC_RET_OK;
}